

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O2

BloomFilter snap_renamefilter(GCtrace *T,SnapNo lim)

{
  BloomFilter BVar1;
  IRIns *pIVar2;
  
  BVar1 = 0;
  for (pIVar2 = T->ir + (T->nins - 1); (pIVar2->field_1).o == '\x14'; pIVar2 = pIVar2 + -1) {
    if ((pIVar2->field_0).op2 <= lim) {
      BVar1 = BVar1 | 1L << ((ulong)*(byte *)pIVar2 & 0x3f);
    }
  }
  return BVar1;
}

Assistant:

static BloomFilter snap_renamefilter(GCtrace *T, SnapNo lim)
{
  BloomFilter rfilt = 0;
  IRIns *ir;
  for (ir = &T->ir[T->nins-1]; ir->o == IR_RENAME; ir--)
    if (ir->op2 <= lim)
      bloomset(rfilt, ir->op1);
  return rfilt;
}